

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AddVerify.cpp
# Opt level: O2

void AddVerifyBase<signed_char,unsigned_int>(char *types)

{
  bool bVar1;
  uint uVar2;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs;
  char t;
  TestCase<signed_char,_unsigned_int,_3> TVar3;
  allocator local_b1;
  char *local_b0;
  string msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  TestVector<signed_char,_unsigned_int,_3> tests;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  tests.test_cases = (TestCase<signed_char,_unsigned_int,_3> *)0x0;
  tests.count = 0;
  tests.current = 0;
  local_b0 = types;
  TVar3 = TestVector<signed_char,_unsigned_int,_3>::GetNext(&tests);
  while( true ) {
    if (tests.count <= tests.current) break;
    t = TVar3.x;
    uVar2 = TVar3._8_4_ & 0xff;
    bVar1 = TVar3.fExpected;
    rhs.m_int = TVar3.y;
    if (bVar1 != (long)((long)t + (TVar3._0_8_ >> 0x20)) < 0x80) {
      std::__cxx11::string::string((string *)&local_50,"Error in case ",&local_b1);
      std::operator+(&local_88,&local_50,local_b0);
      std::operator+(&msg,&local_88,": ");
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::string
                ((string *)&local_88,
                 (char *)CONCAT71(msg._M_dataplus._M_p._1_7_,(char)msg._M_dataplus._M_p),
                 (allocator *)&local_50);
      err_msg<signed_char,unsigned_int>(&local_88,t,rhs.m_int,(bool)(bVar1 & 1));
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&msg);
    }
    msg._M_dataplus._M_p._0_1_ = t;
    SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
    operator+=((SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&msg,rhs.m_int);
    if (uVar2 != 1) {
      std::__cxx11::string::string((string *)&local_50,"Error in case ",&local_b1);
      std::operator+(&local_88,&local_50,local_b0);
      std::operator+(&msg,&local_88," throw (1): ");
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::string
                ((string *)&local_88,
                 (char *)CONCAT71(msg._M_dataplus._M_p._1_7_,(char)msg._M_dataplus._M_p),
                 (allocator *)&local_50);
      err_msg<signed_char,unsigned_int>(&local_88,t,rhs.m_int,(bool)(bVar1 & 1));
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&msg);
    }
    msg._M_dataplus._M_p._0_1_ = t;
    operator+=((char *)&msg,rhs);
    if (uVar2 != 1) {
      std::__cxx11::string::string((string *)&local_50,"Error in case ",&local_b1);
      std::operator+(&local_88,&local_50,local_b0);
      std::operator+(&msg,&local_88," throw (2): ");
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::string
                ((string *)&local_88,
                 (char *)CONCAT71(msg._M_dataplus._M_p._1_7_,(char)msg._M_dataplus._M_p),
                 (allocator *)&local_50);
      err_msg<signed_char,unsigned_int>(&local_88,t,rhs.m_int,(bool)(bVar1 & 1));
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&msg);
    }
    TVar3 = TestVector<signed_char,_unsigned_int,_3>::GetNext(&tests);
  }
  return;
}

Assistant:

void AddVerifyBase(const char* types)
{
	TestVector< T, U, OpType::Add > tests;
	TestCase< T, U, OpType::Add > test = tests.GetNext();

	while (!tests.Done())
	{
		T ret;
		if (SafeAdd(test.x, test.y, ret) != test.fExpected)
		{
			std::string msg = std::string("Error in case ") + types + ": ";
			err_msg(msg.c_str(), test.x, test.y, test.fExpected);
		}

		// Now test throwing version
		bool fSuccess = true;
		try
		{
			SafeInt<T> si(test.x);
			si += test.y;
		}
		catch (...)
		{
			fSuccess = false;
		}

		if (fSuccess != test.fExpected)
		{
			std::string msg = std::string("Error in case ") + types + " throw (1): ";
			err_msg(msg.c_str(), test.x, test.y, test.fExpected);
		}

		// Also need to test the version that assigns back out
		// to a plain int, as it has different logic
		fSuccess = true;
		try
		{
			T x(test.x);
			x += SafeInt<U>(test.y);
		}
		catch (...)
		{
			fSuccess = false;
		}

		if (fSuccess != test.fExpected)
		{
			std::string msg = std::string("Error in case ") + types + " throw (2): ";
			err_msg(msg.c_str(), test.x, test.y, test.fExpected);
		}

		test = tests.GetNext();
	}
}